

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::setQubits
          (QRotationGate2<std::complex<double>_> *this,int *qubits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *__assertion;
  
  uVar2 = *qubits;
  if ((int)uVar2 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    uVar1 = qubits[1];
    if (-1 < (int)uVar1) {
      if (uVar2 != uVar1) {
        if (uVar1 < uVar2) {
          uVar2 = uVar1;
        }
        (this->qubits_)._M_elems[0] = uVar2;
        iVar3 = qubits[1];
        if (qubits[1] < *qubits) {
          iVar3 = *qubits;
        }
        (this->qubits_)._M_elems[1] = iVar3;
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate2.hpp"
                    ,0x90,
                    "virtual void qclab::qgates::QRotationGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
                   );
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate2.hpp"
                ,0x8f,
                "virtual void qclab::qgates::QRotationGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
               );
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          qubits_[0] = std::min( qubits[0] , qubits[1] ) ;
          qubits_[1] = std::max( qubits[0] , qubits[1] ) ;
        }